

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O2

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::ensure_ring
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  SignalLink *pSVar1;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    pSVar1 = (SignalLink *)operator_new(0x38);
    local_28 = 0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    SignalLink::SignalLink(pSVar1,(CbFunction *)&local_38);
    this->callback_ring_ = pSVar1;
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    SignalLink::incref(this->callback_ring_);
    pSVar1 = this->callback_ring_;
    pSVar1->next = pSVar1;
    pSVar1->prev = pSVar1;
  }
  return;
}

Assistant:

void
  ensure_ring ()
  {
    if (!callback_ring_)
      {
        callback_ring_ = new SignalLink (CbFunction()); // ref_count = 1
        callback_ring_->incref(); // ref_count=2, head of ring, can be deactivated but not removed
        callback_ring_->next = callback_ring_; // ring head initialization
        callback_ring_->prev = callback_ring_; // ring tail initialization
      }
  }